

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int __thiscall fmt::File::pipe(File *this,int *__pipedes)

{
  CStringRef message;
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  int result;
  int fds [2];
  File *in_stack_ffffffffffffffa8;
  File *this_00;
  File *this_01;
  undefined4 in_stack_ffffffffffffffc0;
  File in_stack_ffffffffffffffc4;
  File local_38 [3];
  int in_stack_ffffffffffffffd4;
  BasicCStringRef<char> in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int local_18;
  int local_14;
  File *local_10;
  File *local_8;
  
  local_10 = (File *)__pipedes;
  local_8 = this;
  close(this,(int)__pipedes);
  close(local_10,(int)__pipedes);
  memset(&local_18,0,8);
  iVar1 = ::pipe(&local_18);
  if (iVar1 != 0) {
    uVar2 = __cxa_allocate_exception(0x18);
    __errno_location();
    BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffd8,"cannot create pipe");
    message.data_._4_4_ = iVar1;
    message.data_._0_4_ = in_stack_ffffffffffffffe0;
    SystemError::SystemError
              ((SystemError *)in_stack_ffffffffffffffd8.data_,in_stack_ffffffffffffffd4,message);
    __cxa_throw(uVar2,&SystemError::typeinfo,SystemError::~SystemError);
  }
  this_01 = local_38;
  File(this_01,local_18);
  operator=(this_01,in_stack_ffffffffffffffa8);
  ~File((File *)CONCAT44(in_stack_ffffffffffffffc4.fd_,in_stack_ffffffffffffffc0));
  this_00 = (File *)&stack0xffffffffffffffc4;
  File(this_00,local_14);
  operator=(this_01,this_00);
  ~File((File *)CONCAT44(in_stack_ffffffffffffffc4.fd_,in_stack_ffffffffffffffc0));
  return extraout_EAX;
}

Assistant:

void fmt::File::pipe(File &read_end, File &write_end) {
  // Close the descriptors first to make sure that assignments don't throw
  // and there are no leaks.
  read_end.close();
  write_end.close();
  int fds[2] = {};
#ifdef _WIN32
  // Make the default pipe capacity same as on Linux 2.6.11+.
  enum { DEFAULT_CAPACITY = 65536 };
  int result = FMT_POSIX_CALL(pipe(fds, DEFAULT_CAPACITY, _O_BINARY));
#else
  // Don't retry as the pipe function doesn't return EINTR.
  // http://pubs.opengroup.org/onlinepubs/009696799/functions/pipe.html
  int result = FMT_POSIX_CALL(pipe(fds));
#endif
  if (result != 0)
    FMT_THROW(SystemError(errno, "cannot create pipe"));
  // The following assignments don't throw because read_fd and write_fd
  // are closed.
  read_end = File(fds[0]);
  write_end = File(fds[1]);
}